

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

Result init_emulator(Emulator *e,EmulatorInit *init)

{
  FileData *file_data;
  byte bVar1;
  Bool BVar2;
  ulong uVar3;
  EmulatorState *pEVar4;
  Apu *pAVar5;
  EmulatorInit *pEVar6;
  Result RVar7;
  void *pvVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  Bool BVar13;
  CartInfo *pCVar14;
  size_t offset;
  char *pcVar15;
  long lVar16;
  u8 *puVar17;
  u8 checksum;
  byte bVar18;
  uint uVar19;
  char *pcVar20;
  bool bVar21;
  uchar title [17];
  u32 random_seed;
  size_t local_68 [2];
  undefined1 local_58;
  CartInfo *local_50;
  size_t local_48;
  EmulatorInit *local_40;
  u32 local_34;
  
  file_data = &e->file_data;
  local_68[0] = (e->file_data).size;
  pCVar14 = e->cart_infos;
  lVar16 = 0;
  offset = 0;
  local_50 = pCVar14;
  local_48 = local_68[0];
  local_40 = init;
  while( true ) {
    iVar9 = 2;
    if (offset + 0x8000 <= (e->file_data).size) {
      RVar7 = get_cart_info(file_data,offset,pCVar14,TRUE,local_68);
      iVar9 = 0;
      if ((RVar7 == OK) &&
         (iVar9 = 5, s_cart_type_info[pCVar14->cart_type].mbc_type != MBC_TYPE_MMM01)) {
        e->cart_info_count = e->cart_info_count + 1;
        iVar9 = 0;
      }
    }
    if (iVar9 != 0) break;
    lVar16 = lVar16 + 1;
    pCVar14 = pCVar14 + 1;
    offset = offset + 0x8000;
    if (lVar16 == 0x100) {
LAB_00108da3:
      if ((e->cart_info_count == 0) &&
         (RVar7 = get_cart_info(file_data,0,local_50,FALSE,local_68), RVar7 == OK)) {
        e->cart_info_count = e->cart_info_count + 1;
      }
      if (e->cart_info_count == 0) {
        init_emulator_cold_1();
        RVar7 = ERROR;
      }
      else {
        lVar16 = 0;
LAB_00108dda:
        if (local_48 < local_68[0]) {
          file_data_resize(file_data,local_68[0]);
          uVar19 = e->cart_info_count;
          if ((ulong)uVar19 != 0) {
            puVar17 = (e->file_data).data;
            lVar11 = 0;
            do {
              *(u8 **)((long)&e->cart_infos[0].data + lVar11) =
                   puVar17 + *(long *)((long)&e->cart_infos[0].offset + lVar11);
              lVar11 = lVar11 + 0x30;
            } while ((ulong)uVar19 * 0x30 != lVar11);
          }
        }
        set_cart_info(e,(u8)lVar16);
        pCVar14 = e->cart_info;
        local_68[0] = 0;
        local_68[1] = 0;
        local_58 = 0;
        puVar17 = pCVar14->data + 0x134;
        pvVar8 = memchr(puVar17,0,0x10);
        uVar19 = 0x10;
        if (pvVar8 != (void *)0x0) {
          uVar19 = (int)pvVar8 - (int)puVar17;
        }
        memcpy(local_68,puVar17,(long)(int)uVar19);
        if (0 < (int)uVar19) {
          uVar10 = 0;
          do {
            if (*(char *)((long)local_68 + uVar10) < ' ') {
              *(undefined1 *)((long)local_68 + uVar10) = 0x20;
            }
            uVar10 = uVar10 + 1;
          } while (uVar19 != uVar10);
        }
        printf("title: \"%s\"\n",local_68);
        pcVar15 = "unknown";
        if ((ulong)pCVar14->cgb_flag < 0xc1) {
          pcVar15 = *(char **)(get_cgb_flag_string_s_strings + (ulong)pCVar14->cgb_flag * 8);
        }
        if (pcVar15 == (char *)0x0) {
          pcVar15 = "unknown";
        }
        printf("cgb flag: %s\n",pcVar15);
        pcVar15 = "unknown";
        if ((ulong)pCVar14->sgb_flag < 4) {
          pcVar15 = *(char **)(get_sgb_flag_string_s_strings + (ulong)pCVar14->sgb_flag * 8);
        }
        if (pcVar15 == (char *)0x0) {
          pcVar15 = "unknown";
        }
        printf("sgb flag: %s\n",pcVar15);
        pcVar15 = "unknown";
        if ((ulong)pCVar14->cart_type < 0x100) {
          pcVar15 = *(char **)(get_cart_type_string_s_strings + (ulong)pCVar14->cart_type * 8);
        }
        if (pcVar15 == (char *)0x0) {
          pcVar15 = "unknown";
        }
        printf("cart type: %s\n",pcVar15);
        pcVar15 = "unknown";
        if ((ulong)pCVar14->rom_size < 9) {
          pcVar15 = *(char **)(get_rom_size_string_s_strings + (ulong)pCVar14->rom_size * 8);
        }
        if (pcVar15 == (char *)0x0) {
          pcVar15 = "unknown";
        }
        printf("rom size: %s\n",pcVar15);
        pcVar15 = "unknown";
        if ((ulong)pCVar14->ext_ram_size < 6) {
          pcVar15 = *(char **)(get_ext_ram_size_string_s_strings + (ulong)pCVar14->ext_ram_size * 8)
          ;
        }
        pcVar20 = "unknown";
        if (pcVar15 != (char *)0x0) {
          pcVar20 = pcVar15;
        }
        bVar18 = 0;
        printf("ext ram size: %s\n",pcVar20);
        bVar1 = pCVar14->data[0x14d];
        lVar16 = -0x19;
        do {
          bVar18 = bVar18 + ~pCVar14->data[lVar16 + 0x14d];
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0);
        pcVar15 = "unknown";
        if (*(char **)(get_result_string_s_strings + (ulong)(bVar18 != bVar1) * 8) != (char *)0x0) {
          pcVar15 = *(char **)(get_result_string_s_strings + (ulong)(bVar18 != bVar1) * 8);
        }
        BVar13 = FALSE;
        printf("header checksum: 0x%02x [%s]\n",(ulong)bVar1,pcVar15);
        pEVar6 = local_40;
        (e->state).memory_map_state.rom_base[0] = 0;
        (e->state).memory_map_state.rom_base[1] = 0x4000;
        BVar2 = local_40->force_dmg;
        bVar21 = false;
        if (BVar2 == FALSE) {
          bVar21 = (e->cart_info->cgb_flag & 0xffffffbf) == CGB_FLAG_SUPPORTED;
        }
        (e->state).is_cgb = (uint)bVar21;
        if ((BVar2 == FALSE) && (bVar21 == false)) {
          BVar13 = (Bool)(e->cart_info->sgb_flag == SGB_FLAG_SUPPORTED);
        }
        (e->state).is_sgb = BVar13;
        (e->state).reg.F.Z = TRUE;
        (e->state).reg.F.N = FALSE;
        (e->state).reg.F.H = TRUE;
        (e->state).reg.F.C = TRUE;
        (e->state).reg.A = bVar21 * '\x10' + '\x01';
        (e->state).reg.field_1 = (anon_union_2_2_e984aa4b_for_Registers_1)0x13;
        (e->state).reg.field_2 = (anon_union_2_2_e984b20b_for_Registers_3)0xd8;
        (e->state).reg.field_3 = (anon_union_2_2_e984c1e8_for_Registers_5)0x14d;
        (e->state).reg.SP = 0xfffe;
        (e->state).reg.PC = 0x100;
        (e->state).interrupt.ime = FALSE;
        (e->state).timer.div_counter = 0xac00;
        (e->state).next_intr_ticks = 0xffffffffffffffff;
        (e->state).serial.next_intr_ticks = 0xffffffffffffffff;
        (e->state).timer.next_intr_ticks = 0xffffffffffffffff;
        (e->state).wram.offset = 0x1000;
        write_apu(e,0x16,0xf1);
        write_apu(e,1,0x80);
        write_apu(e,2,0xf3);
        write_apu(e,4,0x80);
        write_apu(e,0x14,'w');
        write_apu(e,0x15,0xf3);
        (e->state).apu.initialized = TRUE;
        pEVar4 = &e->state;
        (pEVar4->apu).wave.ram[0] = '`';
        (pEVar4->apu).wave.ram[1] = '\r';
        (pEVar4->apu).wave.ram[2] = 0xda;
        (pEVar4->apu).wave.ram[3] = 0xdd;
        (pEVar4->apu).wave.ram[4] = 'P';
        (pEVar4->apu).wave.ram[5] = '\x0f';
        (pEVar4->apu).wave.ram[6] = 0xad;
        (pEVar4->apu).wave.ram[7] = 0xed;
        pAVar5 = &(e->state).apu;
        (pAVar5->wave).ram[8] = 0xc0;
        (pAVar5->wave).ram[9] = 0xde;
        (pAVar5->wave).ram[10] = 0xf0;
        (pAVar5->wave).ram[0xb] = '\r';
        (pAVar5->wave).ram[0xc] = 0xbe;
        (pAVar5->wave).ram[0xd] = 0xef;
        (pAVar5->wave).ram[0xe] = 0xfe;
        (pAVar5->wave).ram[0xf] = 0xed;
        (e->state).apu.channel[0].envelope.volume = '\0';
        pcVar15 = (char *)0x40;
        write_io(e,0x40,0x91);
        HOOK_write_io_asb(e,pcVar15,0x42,"SCY",0);
        ppu_mode3_synchronize(e);
        (e->state).ppu.scy = '\0';
        write_io(e,0x43,'\0');
        write_io(e,0x45,'\0');
        write_io(e,0x47,0xfc);
        write_io(e,0x48,0xff);
        pcVar15 = (char *)0x49;
        write_io(e,0x49,0xff);
        HOOK_write_io_asb(e,pcVar15,0xf,"IF",1);
        intr_synchronize(e);
        (e->state).interrupt.if_ = '\x01';
        (e->state).interrupt.new_if = '\x01';
        HOOK_write_io_asb(e,pcVar15,0xff,"IE",0);
        (e->state).interrupt.ie = '\0';
        (e->state).hdma.blocks = 0xff;
        emulator_set_builtin_palette(e,pEVar6->builtin_palette);
        e->cgb_color_curve = pEVar6->cgb_color_curve;
        iVar9 = 0;
        do {
          lVar16 = 0x3398c;
          if (iVar9 == 0) {
            lVar16 = 0x338c4;
          }
          uVar10 = 0;
          do {
            *(undefined4 *)
             ((long)(e->config).disable_sound +
             (ulong)((uint)uVar10 & 3) * 4 + (uVar10 >> 2 & 0x3fffffff) * 0x10 + lVar16) =
                 0xffffffff;
            *(undefined2 *)((long)&e->cart_infos[1].cgb_flag + uVar10 * 2 + lVar16) = 0x7fff;
            uVar10 = uVar10 + 1;
          } while (uVar10 != 0x20);
          bVar21 = iVar9 == 0;
          iVar9 = iVar9 + 1;
        } while (bVar21);
        local_34 = pEVar6->random_seed;
        (e->state).random_seed = local_34;
        randomize_buffer(&local_34,(e->state).ext_ram.data,0x20000);
        randomize_buffer(&local_34,(e->state).wram.data,0x8000);
        randomize_buffer(&local_34,(e->state).hram,0x7f);
        (e->state).cpu_tick = 4;
        if ((e->state).ppu.lcdc.display == FALSE) {
          uVar10 = 0xffffffffffffffff;
        }
        else {
          uVar10 = (ulong)(e->state).ppu.state_ticks + (e->state).ppu.sync_ticks;
        }
        (e->state).ppu.next_intr_ticks = uVar10;
        uVar3 = (e->state).serial.next_intr_ticks;
        uVar12 = (e->state).timer.next_intr_ticks;
        if (uVar3 < uVar12) {
          uVar12 = uVar3;
        }
        if (uVar10 <= uVar12) {
          uVar12 = uVar10;
        }
        (e->state).next_intr_ticks = uVar12;
        RVar7 = OK;
      }
      return RVar7;
    }
  }
  if (iVar9 != 2) goto LAB_00108dda;
  goto LAB_00108da3;
}

Assistant:

Result init_emulator(Emulator* e, const EmulatorInit* init) {
  static u8 s_initial_wave_ram[WAVE_RAM_SIZE] = {
      0x60, 0x0d, 0xda, 0xdd, 0x50, 0x0f, 0xad, 0xed,
      0xc0, 0xde, 0xf0, 0x0d, 0xbe, 0xef, 0xfe, 0xed,
  };
  CHECK(SUCCESS(get_cart_infos(e)));
  log_cart_info(e->cart_info);
  MMAP_STATE.rom_base[0] = 0;
  MMAP_STATE.rom_base[1] = 1 << ROM_BANK_SHIFT;
  IS_CGB = !init->force_dmg && (e->cart_info->cgb_flag == CGB_FLAG_SUPPORTED ||
                                e->cart_info->cgb_flag == CGB_FLAG_REQUIRED);
  IS_SGB = !init->force_dmg && !IS_CGB &&
           e->cart_info->sgb_flag == SGB_FLAG_SUPPORTED;
  set_af_reg(e, 0xb0);
  REG.A = IS_CGB ? 0x11 : 0x01;
  REG.BC = 0x0013;
  REG.DE = 0x00d8;
  REG.HL = 0x014d;
  REG.SP = 0xfffe;
  REG.PC = 0x0100;
  INTR.ime = FALSE;
  TIMER.div_counter = 0xAC00;
  TIMER.next_intr_ticks = SERIAL.next_intr_ticks = e->state.next_intr_ticks =
      INVALID_TICKS;
  WRAM.offset = 0x1000;
  /* Enable apu first, so subsequent writes succeed. */
  write_apu(e, APU_NR52_ADDR, 0xf1);
  write_apu(e, APU_NR11_ADDR, 0x80);
  write_apu(e, APU_NR12_ADDR, 0xf3);
  write_apu(e, APU_NR14_ADDR, 0x80);
  write_apu(e, APU_NR50_ADDR, 0x77);
  write_apu(e, APU_NR51_ADDR, 0xf3);
  APU.initialized = TRUE;
  memcpy(&WAVE.ram, s_initial_wave_ram, WAVE_RAM_SIZE);
  /* Turn down the volume on channel1, it is playing by default (because of the
   * GB startup sound), but we don't want to hear it when starting the
   * emulator. */
  CHANNEL1.envelope.volume = 0;
  write_io(e, IO_LCDC_ADDR, 0x91);
  write_io(e, IO_SCY_ADDR, 0x00);
  write_io(e, IO_SCX_ADDR, 0x00);
  write_io(e, IO_LYC_ADDR, 0x00);
  write_io(e, IO_BGP_ADDR, 0xfc);
  write_io(e, IO_OBP0_ADDR, 0xff);
  write_io(e, IO_OBP1_ADDR, 0xff);
  write_io(e, IO_IF_ADDR, 0x1);
  write_io(e, IO_IE_ADDR, 0x0);
  HDMA.blocks = 0xff;

  /* Set initial DMG/SGB palettes */
  emulator_set_builtin_palette(e, init->builtin_palette);

  /* Set up cgb color curve */
  e->cgb_color_curve = init->cgb_color_curve;

  /* Set initial CGB palettes to white. */
  int pal_index;
  for (pal_index = 0; pal_index < 2; ++pal_index) {
    ColorPalettes* palette = pal_index == 0 ? &PPU.bgcp : &PPU.obcp;
    int i;
    for (i = 0; i < 32; ++i) {
      palette->palettes[i >> 2].color[i & 3] = RGBA_WHITE;
      palette->data[i * 2] = 0xff;
      palette->data[i * 2 + 1] = 0x7f;
    }
  }

  /* Randomize RAM */
  u32 random_seed = init->random_seed;
  e->state.random_seed = random_seed;
  randomize_buffer(&random_seed, e->state.ext_ram.data, EXT_RAM_MAX_SIZE);
  randomize_buffer(&random_seed, e->state.wram.data, WORK_RAM_SIZE);
  randomize_buffer(&random_seed, e->state.hram, HIGH_RAM_SIZE);

  e->state.cpu_tick = CPU_TICK;
  calculate_next_ppu_intr(e);
  return OK;
  ON_ERROR_RETURN;
}